

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4hc.c
# Opt level: O2

int LZ4_saveDictHC(LZ4_streamHC_t *LZ4_streamHCPtr,char *safeBuffer,int dictSize)

{
  void *pvVar1;
  uint uVar2;
  uint uVar3;
  LZ4_byte *pLVar4;
  uint uVar5;
  
  pLVar4 = (LZ4_streamHCPtr->internal_donotuse).end;
  pvVar1 = LZ4_streamHCPtr->table[0x8001];
  uVar5 = (int)pLVar4 - ((LZ4_streamHCPtr->internal_donotuse).dictLimit + (int)pvVar1);
  uVar3 = 0x10000;
  if ((uint)dictSize < 0x10000) {
    uVar3 = dictSize;
  }
  uVar2 = 0;
  if (3 < dictSize) {
    uVar2 = uVar3;
  }
  if ((int)uVar5 <= (int)uVar2) {
    uVar2 = uVar5;
  }
  if (0 < (int)uVar2) {
    memmove(safeBuffer,pLVar4 + -(ulong)uVar2,(ulong)uVar2);
    pLVar4 = (LZ4_streamHCPtr->internal_donotuse).end;
    pvVar1 = LZ4_streamHCPtr->table[0x8001];
  }
  (LZ4_streamHCPtr->internal_donotuse).end = (LZ4_byte *)(safeBuffer + (int)uVar2);
  LZ4_streamHCPtr->table[0x8001] =
       safeBuffer + (int)uVar2 + -((long)pLVar4 - (long)pvVar1 & 0xffffffffU);
  uVar3 = (int)((long)pLVar4 - (long)pvVar1) - uVar2;
  (LZ4_streamHCPtr->internal_donotuse).dictLimit = uVar3;
  (LZ4_streamHCPtr->internal_donotuse).lowLimit = uVar3;
  if ((LZ4_streamHCPtr->internal_donotuse).nextToUpdate < uVar3) {
    (LZ4_streamHCPtr->internal_donotuse).nextToUpdate = uVar3;
  }
  return uVar2;
}

Assistant:

int LZ4_saveDictHC (LZ4_streamHC_t* LZ4_streamHCPtr, char* safeBuffer, int dictSize)
{
    LZ4HC_CCtx_internal* const streamPtr = &LZ4_streamHCPtr->internal_donotuse;
    int const prefixSize = (int)(streamPtr->end - (streamPtr->base + streamPtr->dictLimit));
    DEBUGLOG(5, "LZ4_saveDictHC(%p, %p, %d)", LZ4_streamHCPtr, safeBuffer, dictSize);
    assert(prefixSize >= 0);
    if (dictSize > 64 KB) dictSize = 64 KB;
    if (dictSize < 4) dictSize = 0;
    if (dictSize > prefixSize) dictSize = prefixSize;
    if (safeBuffer == NULL) assert(dictSize == 0);
    if (dictSize > 0)
        memmove(safeBuffer, streamPtr->end - dictSize, dictSize);
    {   U32 const endIndex = (U32)(streamPtr->end - streamPtr->base);
        streamPtr->end = (const BYTE*)safeBuffer + dictSize;
        streamPtr->base = streamPtr->end - endIndex;
        streamPtr->dictLimit = endIndex - (U32)dictSize;
        streamPtr->lowLimit = endIndex - (U32)dictSize;
        if (streamPtr->nextToUpdate < streamPtr->dictLimit)
            streamPtr->nextToUpdate = streamPtr->dictLimit;
    }
    return dictSize;
}